

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

Transform * pbrt::LookAt(Point3f *pos,Point3f *look,Vector3f *up)

{
  float fVar1;
  float *pfVar2;
  float *in_RSI;
  ulong i;
  Transform *in_RDI;
  type tVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 extraout_var [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  Vector3<float> VVar13;
  optional<pbrt::SquareMatrix<4>_> worldToCamera;
  Vector3f newUp;
  Vector3f right;
  Vector3f dir;
  SquareMatrix<4> cameraToWorld;
  SquareMatrix<4> *in_stack_00000568;
  undefined8 in_stack_fffffffffffffc88;
  int i_00;
  SquareMatrix<4> *in_stack_fffffffffffffc90;
  SquareMatrix<4> *in_stack_fffffffffffffc98;
  Transform *in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  float fVar14;
  float *in_stack_fffffffffffffcd8;
  size_t sVar15;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  uint uVar16;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  int in_stack_fffffffffffffcf4;
  undefined4 in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffcfc;
  undefined8 in_stack_fffffffffffffd00;
  LogLevel level;
  float *in_stack_fffffffffffffd10;
  float *in_stack_fffffffffffffd18;
  Transform *args_5;
  span<float> local_258;
  span<float> local_248;
  span<float> local_238;
  span<float> local_228;
  span<float> local_218;
  span<float> local_208;
  span<float> local_1f8;
  span<float> local_1e8;
  span<float> local_1d8;
  span<float> local_1c8;
  span<float> local_1b8;
  span<float> local_1a8;
  undefined8 local_198;
  float local_190;
  undefined8 local_188;
  float local_180;
  undefined8 local_178;
  float local_170;
  undefined8 local_168;
  float local_160;
  undefined8 local_158;
  float local_150;
  undefined8 local_148;
  float local_140;
  undefined8 local_138;
  float local_130;
  undefined8 local_128;
  float local_120;
  undefined8 local_118;
  float local_110;
  undefined8 local_108;
  float local_100;
  undefined8 local_f8;
  float local_f0;
  undefined8 local_ec;
  float local_e4;
  undefined8 local_e0;
  float local_d8;
  undefined8 local_d0;
  float local_c8;
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b0;
  float local_a8;
  span<float> local_a0;
  span<float> local_90;
  span<float> local_80;
  span<float> local_70;
  SquareMatrix<4> local_60;
  float *local_10;
  undefined1 auVar12 [56];
  
  i_00 = (int)((ulong)in_stack_fffffffffffffc88 >> 0x20);
  level = (LogLevel)((ulong)in_stack_fffffffffffffd00 >> 0x20);
  args_5 = in_RDI;
  local_10 = in_RSI;
  SquareMatrix<4>::SquareMatrix(&local_60);
  fVar14 = *local_10;
  local_70 = SquareMatrix<4>::operator[](in_stack_fffffffffffffc90,i_00);
  pfVar2 = pstd::span<float>::operator[](&local_70,3);
  *pfVar2 = fVar14;
  fVar14 = local_10[1];
  local_80 = SquareMatrix<4>::operator[](in_stack_fffffffffffffc90,i_00);
  pfVar2 = pstd::span<float>::operator[](&local_80,3);
  *pfVar2 = fVar14;
  fVar14 = local_10[2];
  local_90 = SquareMatrix<4>::operator[](in_stack_fffffffffffffc90,i_00);
  pfVar2 = pstd::span<float>::operator[](&local_90,3);
  auVar12 = (undefined1  [56])0x0;
  *pfVar2 = fVar14;
  local_a0 = SquareMatrix<4>::operator[](in_stack_fffffffffffffc90,i_00);
  pfVar2 = pstd::span<float>::operator[](&local_a0,3);
  *pfVar2 = 1.0;
  VVar13 = Point3<float>::operator-
                     ((Point3<float> *)in_stack_fffffffffffffca0,
                      (Point3<float> *)in_stack_fffffffffffffc98);
  local_c8 = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar4._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar12;
  local_d0 = vmovlpd_avx(auVar4._0_16_);
  local_c0 = local_d0;
  local_b8 = local_c8;
  VVar13 = Normalize<float>((Vector3<float> *)
                            CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  local_d8 = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar5._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar12;
  local_e0 = vmovlpd_avx(auVar5._0_16_);
  local_b0 = local_e0;
  local_a8 = local_d8;
  VVar13 = Normalize<float>((Vector3<float> *)
                            CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  local_100 = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._8_56_ = auVar12;
  local_108 = vmovlpd_avx(auVar6._0_16_);
  local_f8 = local_108;
  local_f0 = local_100;
  VVar13 = Cross<float>((Vector3<float> *)in_stack_fffffffffffffca0,
                        (Vector3<float> *)in_stack_fffffffffffffc98);
  local_110 = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = auVar12;
  local_118 = vmovlpd_avx(auVar7._0_16_);
  local_ec = local_118;
  local_e4 = local_110;
  tVar3 = Length<float>((Vector3<float> *)0x934592);
  if ((tVar3 == 0.0) && (!NAN(tVar3))) {
    LogFatal<float_const&,float_const&,float_const&,float&,float&,float&>
              (level,(char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
               in_stack_fffffffffffffcf4,
               (char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
               (float *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
               in_stack_fffffffffffffcd8,in_stack_fffffffffffffd10,in_stack_fffffffffffffd18,
               (float *)in_RDI,(float *)args_5);
  }
  auVar12 = extraout_var;
  VVar13 = Normalize<float>((Vector3<float> *)
                            CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  local_150 = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar12;
  local_158 = vmovlpd_avx(auVar8._0_16_);
  local_148 = local_158;
  local_140 = local_150;
  VVar13 = Cross<float>((Vector3<float> *)in_stack_fffffffffffffca0,
                        (Vector3<float> *)in_stack_fffffffffffffc98);
  local_160 = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar12;
  local_168 = vmovlpd_avx(auVar9._0_16_);
  local_138 = local_168;
  local_130 = local_160;
  VVar13 = Normalize<float>((Vector3<float> *)
                            CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  local_170 = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar10._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar12;
  local_178 = vmovlpd_avx(auVar10._0_16_);
  local_128 = local_178;
  local_120 = local_170;
  VVar13 = Cross<float>((Vector3<float> *)in_stack_fffffffffffffca0,
                        (Vector3<float> *)in_stack_fffffffffffffc98);
  local_190 = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar11._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar11._8_56_ = auVar12;
  local_198 = vmovlpd_avx(auVar11._0_16_);
  uVar16 = 0;
  fVar14 = (float)local_128;
  local_188 = local_198;
  local_180 = local_190;
  local_1a8 = SquareMatrix<4>::operator[](in_stack_fffffffffffffc90,i_00);
  i = (ulong)uVar16;
  pfVar2 = pstd::span<float>::operator[](&local_1a8,i);
  *pfVar2 = fVar14;
  fVar14 = local_128._4_4_;
  local_1b8 = SquareMatrix<4>::operator[](in_stack_fffffffffffffc90,i_00);
  pfVar2 = pstd::span<float>::operator[](&local_1b8,i);
  fVar1 = local_120;
  *pfVar2 = fVar14;
  local_1c8 = SquareMatrix<4>::operator[](in_stack_fffffffffffffc90,i_00);
  pfVar2 = pstd::span<float>::operator[](&local_1c8,i);
  *pfVar2 = fVar1;
  local_1d8 = SquareMatrix<4>::operator[](in_stack_fffffffffffffc90,i_00);
  pfVar2 = pstd::span<float>::operator[](&local_1d8,i);
  *pfVar2 = 0.0;
  fVar14 = (float)local_188;
  local_1e8 = SquareMatrix<4>::operator[](in_stack_fffffffffffffc90,i_00);
  sVar15 = 1;
  pfVar2 = pstd::span<float>::operator[](&local_1e8,1);
  *pfVar2 = fVar14;
  fVar14 = local_188._4_4_;
  local_1f8 = SquareMatrix<4>::operator[](in_stack_fffffffffffffc90,i_00);
  pfVar2 = pstd::span<float>::operator[](&local_1f8,sVar15);
  fVar1 = local_180;
  *pfVar2 = fVar14;
  local_208 = SquareMatrix<4>::operator[](in_stack_fffffffffffffc90,i_00);
  pfVar2 = pstd::span<float>::operator[](&local_208,sVar15);
  *pfVar2 = fVar1;
  local_218 = SquareMatrix<4>::operator[](in_stack_fffffffffffffc90,i_00);
  pfVar2 = pstd::span<float>::operator[](&local_218,sVar15);
  *pfVar2 = 0.0;
  fVar14 = (float)local_b0;
  local_228 = SquareMatrix<4>::operator[](in_stack_fffffffffffffc90,i_00);
  sVar15 = 2;
  pfVar2 = pstd::span<float>::operator[](&local_228,2);
  *pfVar2 = fVar14;
  fVar14 = local_b0._4_4_;
  local_238 = SquareMatrix<4>::operator[](in_stack_fffffffffffffc90,i_00);
  pfVar2 = pstd::span<float>::operator[](&local_238,sVar15);
  *pfVar2 = fVar14;
  fVar14 = local_a8;
  local_248 = SquareMatrix<4>::operator[](in_stack_fffffffffffffc90,i_00);
  pfVar2 = pstd::span<float>::operator[](&local_248,sVar15);
  *pfVar2 = fVar14;
  local_258 = SquareMatrix<4>::operator[](in_stack_fffffffffffffc90,i_00);
  pfVar2 = pstd::span<float>::operator[](&local_258,sVar15);
  *pfVar2 = 0.0;
  Inverse<4>(in_stack_00000568);
  pstd::optional<pbrt::SquareMatrix<4>_>::operator*((optional<pbrt::SquareMatrix<4>_> *)0x934ac1);
  Transform::Transform
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
  pstd::optional<pbrt::SquareMatrix<4>_>::~optional((optional<pbrt::SquareMatrix<4>_> *)0x934af7);
  return args_5;
}

Assistant:

Transform LookAt(const Point3f &pos, const Point3f &look, const Vector3f &up) {
    SquareMatrix<4> cameraToWorld;
    // Initialize fourth column of viewing matrix
    cameraToWorld[0][3] = pos.x;
    cameraToWorld[1][3] = pos.y;
    cameraToWorld[2][3] = pos.z;
    cameraToWorld[3][3] = 1;

    // Initialize first three columns of viewing matrix
    Vector3f dir = Normalize(look - pos);
    if (Length(Cross(Normalize(up), dir)) == 0)
        LOG_FATAL("LookAt: \"up\" vector (%f, %f, %f) and viewing direction "
                  "(%f, %f, %f) "
                  "passed to LookAt are pointing in the same direction.",
                  up.x, up.y, up.z, dir.x, dir.y, dir.z);
    Vector3f right = Normalize(Cross(Normalize(up), dir));
    Vector3f newUp = Cross(dir, right);
    cameraToWorld[0][0] = right.x;
    cameraToWorld[1][0] = right.y;
    cameraToWorld[2][0] = right.z;
    cameraToWorld[3][0] = 0.;
    cameraToWorld[0][1] = newUp.x;
    cameraToWorld[1][1] = newUp.y;
    cameraToWorld[2][1] = newUp.z;
    cameraToWorld[3][1] = 0.;
    cameraToWorld[0][2] = dir.x;
    cameraToWorld[1][2] = dir.y;
    cameraToWorld[2][2] = dir.z;
    cameraToWorld[3][2] = 0.;

    pstd::optional<SquareMatrix<4>> worldToCamera = Inverse(cameraToWorld);
#ifndef NDEBUG
    DCHECK(worldToCamera);
#endif  // !NDEBUG
    return Transform(*worldToCamera, cameraToWorld);
}